

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O3

void chrono::
     _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>*>,chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>
               (list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
                *contactlist,
               _List_iterator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>
               *lastcontact,int *n_added,ChContactContainer *container,
               ChContactable_3vars<3,_3,_3> *objA,ChContactable_3vars<3,_3,_3> *objB,
               ChCollisionInfo *cinfo,ChMaterialCompositeSMC *cmat)

{
  size_t *psVar1;
  ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_> *this;
  _List_node_base *p_Var2;
  
  if (lastcontact->_M_node == (_List_node_base *)contactlist) {
    this = (ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
            *)::operator_new(0xe0);
    ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>::
    ChContactTuple((ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
                    *)this,container,objA,objB,cinfo);
    (this->
    super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
    )._vptr_ChContactTuple = (_func_int **)&PTR__ChContactSMC_00b15620;
    (this->m_force).m_data[0] = 0.0;
    (this->m_force).m_data[1] = 0.0;
    (this->m_force).m_data[2] = 0.0;
    this->m_Jac = (ChContactJacobian *)0x0;
    ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>::Reset
              (this,objA,objB,cinfo,cmat);
    p_Var2 = (_List_node_base *)::operator_new(0x18);
    p_Var2[1]._M_next = (_List_node_base *)this;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    psVar1 = &(contactlist->
              super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>::Reset
              ((ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
                *)lastcontact->_M_node[1]._M_next,objA,objB,cinfo,cmat);
    contactlist = (list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
                   *)lastcontact->_M_node->_M_next;
  }
  lastcontact->_M_node = (_List_node_base *)contactlist;
  *n_added = *n_added + 1;
  return;
}

Assistant:

void _OptimalContactInsert(std::list<Tcont*>& contactlist,           // contact list
                           Titer& lastcontact,                       // last contact acquired
                           int& n_added,                             // number of contacts inserted
                           ChContactContainer* container,            // contact container
                           Ta* objA,                                 // collidable object A
                           Tb* objB,                                 // collidable object B
                           const collision::ChCollisionInfo& cinfo,  // collision information
                           const ChMaterialCompositeSMC& cmat        // composite material
) {
    if (lastcontact != contactlist.end()) {
        // reuse old contacts
        (*lastcontact)->Reset(objA, objB, cinfo, cmat);
        lastcontact++;
    } else {
        // add new contact
        Tcont* mc = new Tcont(container, objA, objB, cinfo, cmat);
        contactlist.push_back(mc);
        lastcontact = contactlist.end();
    }
    n_added++;
}